

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

SUNErrCode
N_VLinearCombinationVectorArray_Serial(int nvec,int nsum,sunrealtype *c,N_Vector **X,N_Vector *Z)

{
  sunrealtype sVar1;
  N_Vector *X_00;
  ulong uVar2;
  undefined1 auVar3 [16];
  N_Vector *X_01;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  long lVar11;
  
  uVar2 = (ulong)(uint)nsum;
  X_00 = *X;
  if (nvec == 1) {
    if (nsum == 2) {
      N_VLinearSum_Serial(*c,*X_00,c[1],*X[1],*Z);
      return 0;
    }
    if (nsum == 1) {
      N_VScale_Serial(*c,*X_00,*Z);
      return 0;
    }
    X_01 = (N_Vector *)malloc((long)nsum << 3);
    if (0 < nsum) {
      uVar5 = 0;
      do {
        X_01[uVar5] = *X[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar2 != uVar5);
    }
    N_VLinearCombination_Serial(nsum,c,X_01,*Z);
  }
  else {
    if (nsum == 2) {
      N_VLinearSumVectorArray_Serial(nvec,*c,X_00,c[1],X[1],Z);
      return 0;
    }
    if (nsum != 1) {
      lVar4 = *(*Z)->content;
      if (X_00 == Z) {
        if ((*c == 1.0) && (!NAN(*c))) {
          if (nvec < 1) {
            return 0;
          }
          uVar5 = 0;
          do {
            if (1 < nsum) {
              lVar11 = *(long *)((long)Z[uVar5]->content + 0x10);
              uVar6 = 1;
              do {
                if (0 < lVar4) {
                  lVar7 = *(long *)((long)X[uVar6][uVar5]->content + 0x10);
                  lVar8 = 0;
                  do {
                    *(double *)(lVar11 + lVar8 * 8) =
                         c[uVar6] * *(double *)(lVar7 + lVar8 * 8) + *(double *)(lVar11 + lVar8 * 8)
                    ;
                    lVar8 = lVar8 + 1;
                  } while (lVar4 != lVar8);
                }
                uVar6 = uVar6 + 1;
              } while (uVar6 != uVar2);
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 != (uint)nvec);
          return 0;
        }
        if (X_00 == Z) {
          if (nvec < 1) {
            return 0;
          }
          uVar5 = 0;
          do {
            lVar11 = *(long *)((long)Z[uVar5]->content + 0x10);
            if (0 < lVar4) {
              lVar7 = 0;
              do {
                *(double *)(lVar11 + lVar7 * 8) = *c * *(double *)(lVar11 + lVar7 * 8);
                lVar7 = lVar7 + 1;
              } while (lVar4 != lVar7);
            }
            if (1 < nsum) {
              uVar6 = 1;
              do {
                if (0 < lVar4) {
                  lVar7 = *(long *)((long)X[uVar6][uVar5]->content + 0x10);
                  lVar8 = 0;
                  do {
                    *(double *)(lVar11 + lVar8 * 8) =
                         c[uVar6] * *(double *)(lVar7 + lVar8 * 8) + *(double *)(lVar11 + lVar8 * 8)
                    ;
                    lVar8 = lVar8 + 1;
                  } while (lVar4 != lVar8);
                }
                uVar6 = uVar6 + 1;
              } while (uVar6 != uVar2);
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 != (uint)nvec);
          return 0;
        }
      }
      if (nvec < 1) {
        return 0;
      }
      uVar5 = 0;
      do {
        lVar11 = *(long *)((long)Z[uVar5]->content + 0x10);
        if (0 < lVar4) {
          lVar7 = *(long *)((long)X_00[uVar5]->content + 0x10);
          lVar8 = 0;
          do {
            *(double *)(lVar11 + lVar8 * 8) = *c * *(double *)(lVar7 + lVar8 * 8);
            lVar8 = lVar8 + 1;
          } while (lVar4 != lVar8);
        }
        if (1 < nsum) {
          uVar6 = 1;
          do {
            if (0 < lVar4) {
              lVar7 = *(long *)((long)X[uVar6][uVar5]->content + 0x10);
              lVar8 = 0;
              do {
                *(double *)(lVar11 + lVar8 * 8) =
                     c[uVar6] * *(double *)(lVar7 + lVar8 * 8) + *(double *)(lVar11 + lVar8 * 8);
                lVar8 = lVar8 + 1;
              } while (lVar4 != lVar8);
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 != uVar2);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != (uint)nvec);
      return 0;
    }
    X_01 = (N_Vector *)malloc((long)nvec << 3);
    auVar3 = _DAT_00138040;
    if (0 < nvec) {
      sVar1 = *c;
      lVar4 = (ulong)(uint)nvec - 1;
      auVar9._8_4_ = (int)lVar4;
      auVar9._0_8_ = lVar4;
      auVar9._12_4_ = (int)((ulong)lVar4 >> 0x20);
      lVar4 = 0;
      auVar9 = auVar9 ^ _DAT_00138040;
      auVar10 = _DAT_00138030;
      do {
        auVar12 = auVar10 ^ auVar3;
        if ((bool)(~(auVar12._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar12._0_4_ ||
                    auVar9._4_4_ < auVar12._4_4_) & 1)) {
          *(sunrealtype *)((long)X_01 + lVar4) = sVar1;
        }
        if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
            auVar12._12_4_ <= auVar9._12_4_) {
          *(sunrealtype *)((long)X_01 + lVar4 + 8) = sVar1;
        }
        lVar11 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 2;
        auVar10._8_8_ = lVar11 + 2;
        lVar4 = lVar4 + 0x10;
      } while ((ulong)(nvec + 1U >> 1) << 4 != lVar4);
    }
    N_VScaleVectorArray_Serial(nvec,(sunrealtype *)X_01,X_00,Z);
  }
  free(X_01);
  return 0;
}

Assistant:

SUNErrCode N_VLinearCombinationVectorArray_Serial(int nvec, int nsum,
                                                  sunrealtype* c, N_Vector** X,
                                                  N_Vector* Z)
{
  SUNFunctionBegin(X[0][0]->sunctx);
  int i;          /* vector arrays index in summation [0,nsum) */
  int j;          /* vector index in vector array     [0,nvec) */
  sunindextype k; /* element index in vector          [0,N)    */
  sunindextype N;
  sunrealtype* zd = NULL;
  sunrealtype* xd = NULL;
  sunrealtype* ctmp;
  N_Vector* Y;

  /* invalid number of vectors */
  SUNAssert(nvec >= 1 && nsum >= 1, SUN_ERR_ARG_OUTOFRANGE);

  /* ---------------------------
   * Special cases for nvec == 1
   * --------------------------- */

  if (nvec == 1)
  {
    /* should have called N_VScale */
    if (nsum == 1)
    {
      N_VScale_Serial(c[0], X[0][0], Z[0]);
      SUNCheckLastErr();
      return SUN_SUCCESS;
    }

    /* should have called N_VLinearSum */
    if (nsum == 2)
    {
      N_VLinearSum_Serial(c[0], X[0][0], c[1], X[1][0], Z[0]);
      SUNCheckLastErr();
      return SUN_SUCCESS;
    }

    /* should have called N_VLinearCombination */
    Y = (N_Vector*)malloc(nsum * sizeof(N_Vector));
    SUNAssert(Y, SUN_ERR_MALLOC_FAIL);

    for (i = 0; i < nsum; i++) { Y[i] = X[i][0]; }

    SUNCheckCall(N_VLinearCombination_Serial(nsum, c, Y, Z[0]));

    free(Y);

    return SUN_SUCCESS;
  }

  /* --------------------------
   * Special cases for nvec > 1
   * -------------------------- */

  /* should have called N_VScaleVectorArray */
  if (nsum == 1)
  {
    ctmp = (sunrealtype*)malloc(nvec * sizeof(sunrealtype));
    SUNAssert(ctmp, SUN_ERR_MALLOC_FAIL);

    for (j = 0; j < nvec; j++) { ctmp[j] = c[0]; }

    SUNCheckCall(N_VScaleVectorArray_Serial(nvec, ctmp, X[0], Z));

    free(ctmp);
    return SUN_SUCCESS;
  }

  /* should have called N_VLinearSumVectorArray */
  if (nsum == 2)
  {
    SUNCheckCall(N_VLinearSumVectorArray_Serial(nvec, c[0], X[0], c[1], X[1], Z));
    return SUN_SUCCESS;
  }

  /* --------------------------
   * Compute linear combination
   * -------------------------- */

  /* get vector length */
  N = NV_LENGTH_S(Z[0]);

  /*
   * X[0][j] += c[i]*X[i][j], i = 1,...,nvec-1
   */
  if ((X[0] == Z) && (c[0] == ONE))
  {
    for (j = 0; j < nvec; j++)
    {
      zd = NV_DATA_S(Z[j]);
      for (i = 1; i < nsum; i++)
      {
        xd = NV_DATA_S(X[i][j]);
        for (k = 0; k < N; k++) { zd[k] += c[i] * xd[k]; }
      }
    }
    return SUN_SUCCESS;
  }

  /*
   * X[0][j] = c[0] * X[0][j] + sum{ c[i] * X[i][j] }, i = 1,...,nvec-1
   */
  if (X[0] == Z)
  {
    for (j = 0; j < nvec; j++)
    {
      zd = NV_DATA_S(Z[j]);
      for (k = 0; k < N; k++) { zd[k] *= c[0]; }
      for (i = 1; i < nsum; i++)
      {
        xd = NV_DATA_S(X[i][j]);
        for (k = 0; k < N; k++) { zd[k] += c[i] * xd[k]; }
      }
    }
    return SUN_SUCCESS;
  }

  /*
   * Z[j] = sum{ c[i] * X[i][j] }, i = 0,...,nvec-1
   */
  for (j = 0; j < nvec; j++)
  {
    xd = NV_DATA_S(X[0][j]);
    zd = NV_DATA_S(Z[j]);
    for (k = 0; k < N; k++) { zd[k] = c[0] * xd[k]; }
    for (i = 1; i < nsum; i++)
    {
      xd = NV_DATA_S(X[i][j]);
      for (k = 0; k < N; k++) { zd[k] += c[i] * xd[k]; }
    }
  }
  return SUN_SUCCESS;
}